

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RealEvaluator::tryEvaluateBinaryPred
          (RealEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  RationalConstantType *o;
  
  switch(op) {
  case REAL_GREATER:
    o = &arg2->super_RationalConstantType;
    arg2 = arg1;
    break;
  case REAL_GREATER_EQUAL:
    bVar1 = RationalConstantType::operator>=
                      (&arg1->super_RationalConstantType,&arg2->super_RationalConstantType);
    goto LAB_00436c2f;
  case REAL_LESS:
    o = &arg1->super_RationalConstantType;
    break;
  case REAL_LESS_EQUAL:
    bVar1 = RationalConstantType::operator<=
                      (&arg1->super_RationalConstantType,&arg2->super_RationalConstantType);
    goto LAB_00436c2f;
  default:
    return false;
  }
  bVar1 = RationalConstantType::operator>(&arg2->super_RationalConstantType,o);
LAB_00436c2f:
  *res = bVar1;
  return true;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::REAL_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::REAL_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::REAL_LESS:
      res = arg1<arg2;
      return true;
    case Theory::REAL_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    default:
      return false;
    }
  }